

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::Secp256k1::NegatePrivkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *privkey)

{
  secp256k1_context *ctx;
  size_t sVar1;
  CfdException *pCVar2;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_work;
  int local_64;
  undefined1 local_60 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    local_60._0_8_ = "cfdcore_secp256k1.cpp";
    local_60._8_4_ = 0x18d;
    local_60._16_8_ = "NegatePrivkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_60,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_60 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ByteData::GetDataSize(privkey);
  if (sVar1 == 0x20) {
    ByteData::GetBytes(&local_40,privkey);
    local_64 = secp256k1_ec_privkey_negate
                         (ctx,local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (local_64 == 1) {
      ByteData::ByteData(__return_storage_ptr__,&local_40);
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_60._0_8_ = "cfdcore_secp256k1.cpp";
    local_60._8_4_ = 0x19b;
    local_60._16_8_ = "NegatePrivkeySecp256k1Ec";
    logger::log<int&>((CfdSourceLocation *)local_60,kCfdLogLevelWarning,
                      "secp256k1_ec_pubkey_negate Error.({})",&local_64);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_60._0_8_ = local_60 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,"Secp256k1 pubkey negate Error.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_60._0_8_ = "cfdcore_secp256k1.cpp";
  local_60._8_4_ = 0x192;
  local_60._16_8_ = "NegatePrivkeySecp256k1Ec";
  logger::log<>((CfdSourceLocation *)local_60,kCfdLogLevelWarning,"Invalid Argument privkey size.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_60._0_8_ = local_60 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Invalid privkey size.","");
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_60);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::NegatePrivkeySecp256k1Ec(const ByteData& privkey) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (privkey.GetDataSize() != 32) {
    warn(CFD_LOG_SOURCE, "Invalid Argument privkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid privkey size.");
  }

  int ret;
  std::vector<uint8_t> privkey_work = privkey.GetBytes();
  ret = secp256k1_ec_privkey_negate(context, privkey_work.data());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_ec_pubkey_negate Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey negate Error.");
  }
  return ByteData(privkey_work);
}